

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlSaveWriteIndent(xmlSaveCtxtPtr ctxt,int extra)

{
  int *piVar1;
  int iVar2;
  
  if (((uint)ctxt->options >> 9 & 1) != 0) {
    return;
  }
  if ((((uint)ctxt->options >> 10 & 1) == 0) && (piVar1 = __xmlIndentTreeOutput(), *piVar1 == 0)) {
    return;
  }
  iVar2 = extra + ctxt->level;
  if (ctxt->indent_nr <= iVar2) {
    iVar2 = ctxt->indent_nr;
  }
  xmlOutputBufferWrite(ctxt->buf,iVar2 * ctxt->indent_size,ctxt->indent);
  return;
}

Assistant:

static void
xmlSaveWriteIndent(xmlSaveCtxtPtr ctxt, int extra)
{
    int level;

    if ((ctxt->options & XML_SAVE_NO_INDENT) ||
        (((ctxt->options & XML_SAVE_INDENT) == 0) &&
         (xmlIndentTreeOutput == 0)))
        return;

    level = ctxt->level + extra;
    if (level > ctxt->indent_nr)
        level = ctxt->indent_nr;
    xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size * level, ctxt->indent);
}